

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidobjs.c
# Opt level: O3

FT_Error cid_face_init(FT_Stream stream,FT_Face cidface,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  FT_ULong *pFVar1;
  ulong *puVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  FT_Memory pFVar9;
  unsigned_long uVar10;
  FT_String *pFVar11;
  FT_Byte *__s1;
  short sVar12;
  FT_Error FVar13;
  int iVar14;
  int iVar15;
  void *pvVar16;
  CID_FaceDict pCVar17;
  char *pcVar18;
  FT_ULong FVar19;
  ulong uVar20;
  size_t sVar21;
  short sVar22;
  char *pcVar23;
  long lVar24;
  ushort uVar25;
  short sVar26;
  FT_Stream pFVar27;
  FT_Int FVar28;
  FT_Byte *pFVar29;
  FT_Byte *pFVar30;
  FT_Stream pFVar31;
  FT_Byte FVar32;
  FT_Byte *pFVar33;
  CID_Face pCVar34;
  T1_FieldRec *pTVar35;
  FT_ULong FVar36;
  FT_Byte *pFVar37;
  long lVar38;
  byte bVar39;
  undefined8 local_278;
  FT_Byte local_270;
  FT_Byte local_26f [271];
  FT_Memory local_160;
  CID_FaceDict local_158;
  CID_FaceDict local_150;
  CID_FaceDict local_148;
  FT_Byte *local_140;
  FT_Byte *local_138;
  FT_Byte *local_130;
  int local_128;
  code *local_110;
  code *local_108;
  code *local_100;
  code *local_c0;
  code *local_b8;
  FT_Stream local_b0;
  FT_Byte *local_a8;
  FT_Byte *local_a0;
  FT_Byte *local_98;
  ulong local_90;
  int local_80;
  undefined8 local_78;
  FT_Byte *local_70;
  CID_FaceDict local_68;
  FT_ULong local_60;
  ulong local_58;
  FT_Stream local_50;
  FT_Byte *local_48;
  CID_Face local_40;
  FT_Int local_38;
  FT_Error local_34;
  
  bVar39 = 0;
  cidface->num_faces = 1;
  if (cidface[1].face_index == 0) {
    pvVar16 = FT_Get_Module_Interface((cidface->driver->root).library,"psaux");
    if (pvVar16 == (void *)0x0) {
      return 0xb;
    }
    cidface[1].face_index = (FT_Long)pvVar16;
  }
  if (cidface[2].bbox.yMin == 0) {
    pvVar16 = FT_Get_Module_Interface((cidface->driver->root).library,"pshinter");
    cidface[2].bbox.yMin = (FT_Pos)pvVar16;
  }
  FVar13 = FT_Stream_Seek(stream,0);
  if (FVar13 != 0) {
    return FVar13;
  }
  pFVar9 = cidface->memory;
  local_78 = 0;
  pFVar27 = cidface->stream;
  lVar38 = cidface[1].face_index;
  local_38 = face_index;
  memset(&local_140,0,200);
  (*(code *)**(undefined8 **)(lVar38 + 8))(&local_140,0,0);
  local_b0 = pFVar27;
  pCVar17 = (CID_FaceDict)FT_Stream_Pos(pFVar27);
  FVar13 = FT_Stream_EnterFrame(pFVar27,0x1f);
  pCVar34 = (CID_Face)cidface;
  FVar28 = local_38;
  local_40 = (CID_Face)cidface;
  if (FVar13 == 0) {
    iVar14 = strncmp((char *)pFVar27->cursor,"%!PS-Adobe-3.0 Resource-CIDFont",0x1f);
    FT_Stream_ExitFrame(pFVar27);
    if (iVar14 == 0) {
      local_58 = -(long)pCVar17;
      local_160 = pFVar9;
      local_68 = pCVar17;
      local_50 = pFVar27;
LAB_001ffb11:
      pFVar27 = local_50;
      local_60 = FT_Stream_Pos(local_50);
      uVar10 = pFVar27->size;
      FVar19 = FT_Stream_Pos(pFVar27);
      FVar19 = uVar10 - FVar19;
      if (0x108 < FVar19) {
        FVar19 = 0x109;
      }
      pFVar29 = (FT_Byte *)&local_278;
      FVar13 = FT_Stream_Read(pFVar27,pFVar29,FVar19);
      pCVar34 = local_40;
      FVar28 = local_38;
      if (FVar13 == 0) {
        pFVar37 = (FT_Byte *)0x0;
        do {
          local_48 = pFVar37;
          local_70 = pFVar29;
          pFVar29 = pFVar29 + FVar19;
          *pFVar29 = '\0';
          if (&local_278 < pFVar29 + -6) {
            pFVar37 = (FT_Byte *)&local_278;
            FVar36 = local_60;
            FVar32 = (FT_Byte)local_278;
            do {
              if ((FVar32 == 'S') && (iVar14 = strncmp((char *)pFVar37,"StartData",9), iVar14 == 0))
              {
                lVar38 = 10;
LAB_001ffc67:
                pFVar27 = local_50;
                FVar13 = FT_Stream_Seek(local_50,(FT_ULong)local_68);
                pCVar34 = local_40;
                FVar28 = local_38;
                if (FVar13 != 0) goto LAB_001ff9f2;
                pFVar29 = (FT_Byte *)(lVar38 + FVar36);
                pFVar37 = pFVar29 + local_58;
                FVar13 = FT_Stream_ExtractFrame(pFVar27,(FT_ULong)pFVar37,&local_a8);
                pFVar30 = local_a8;
                pCVar34 = local_40;
                FVar28 = local_38;
                if (FVar13 != 0) goto LAB_001ff9f2;
                local_138 = local_a8;
                local_140 = local_a8;
                local_130 = local_a8 + lVar38 + local_58 + FVar36;
                local_80 = -1;
                local_a0 = pFVar37;
                local_98 = pFVar29;
                local_48 = pFVar29;
                (*local_100)(&local_140);
                (*local_108)(&local_140);
                pFVar37 = local_140;
                (*local_100)(&local_140);
                (*local_108)(&local_140);
                pFVar29 = local_130 + -6;
                if (pFVar29 < local_140) goto LAB_001ffdc6;
                pFVar33 = local_130 + -9;
                goto LAB_001ffd36;
              }
              FVar32 = pFVar37[1];
              if ((FVar32 == 's') && (iVar14 = strncmp((char *)pFVar37,"/sfnts",6), iVar14 == 0)) {
                lVar38 = 7;
                goto LAB_001ffc67;
              }
              pFVar37 = pFVar37 + 1;
              FVar36 = FVar36 + 1;
            } while (pFVar37 < pFVar29 + -6);
          }
          pFVar27 = local_50;
          if (local_48 + FVar19 < (FT_Byte *)0x9) goto LAB_0020020a;
          local_278 = *(CID_FaceDict *)(local_70 + (FVar19 - 9));
          local_270 = local_70[FVar19 - 1];
          local_60 = local_60 + 0x100;
          uVar10 = local_50->size;
          FVar19 = FT_Stream_Pos(local_50);
          FVar19 = uVar10 - FVar19;
          if (0xff < FVar19) {
            FVar19 = 0x100;
          }
          pFVar29 = local_26f;
          FVar13 = FT_Stream_Read(pFVar27,pFVar29,FVar19);
          pFVar37 = (FT_Byte *)0x9;
          pCVar34 = local_40;
          FVar28 = local_38;
        } while (FVar13 == 0);
      }
      goto LAB_001ff9f2;
    }
LAB_001ff9e3:
    pCVar34 = local_40;
    FVar28 = local_38;
    FVar13 = 2;
  }
  goto LAB_001ff9f2;
  while( true ) {
    if ((local_140 <= pFVar33 && *local_140 == 'S') &&
       (iVar14 = strncmp((char *)local_140,"StartData",9), iVar14 == 0)) {
      iVar14 = strncmp((char *)pFVar30,"(Hex)",5);
      pCVar34 = local_40;
      uVar20 = local_90;
      if ((iVar14 == 0) && (uVar20 = strtol((char *)pFVar37,(char **)0x0,10), (long)uVar20 < 0))
      goto LAB_0020020a;
      local_90 = uVar20;
      local_34 = 0;
      local_130 = local_a8 + (long)local_a0;
      local_128 = 0;
      local_70 = local_a8 + -0x12 + (long)local_a0;
      local_68 = (CID_FaceDict)&pCVar34->cid;
      local_158 = (CID_FaceDict)&(pCVar34->cid).font_bbox;
      local_150 = (CID_FaceDict)&pCVar34->font_extra;
      local_148 = (CID_FaceDict)&(pCVar34->cid).font_info;
      pFVar29 = local_a8;
      pFVar37 = local_130;
      local_48 = local_130;
      goto LAB_001fffd9;
    }
    if ((__s1[1] == 's') && (iVar14 = strncmp((char *)__s1,"/sfnts",6), iVar14 == 0))
    goto LAB_001ff9e3;
    (*local_100)(&local_140);
    (*local_108)(&local_140);
    pFVar30 = pFVar37;
    pFVar37 = __s1;
    if (pFVar29 < local_140) break;
LAB_001ffd36:
    __s1 = local_140;
    pCVar34 = local_40;
    FVar28 = local_38;
    FVar13 = local_128;
    if (local_128 != 0) goto LAB_001ff9f2;
  }
LAB_001ffdc6:
  pFVar27 = local_50;
  FT_Stream_ReleaseFrame(local_50,&local_a8);
  FVar13 = FT_Stream_Seek(pFVar27,(FT_ULong)local_48);
  pCVar34 = local_40;
  FVar28 = local_38;
  if (FVar13 != 0) goto LAB_001ff9f2;
  goto LAB_001ffb11;
code_r0x0020007c:
  if (pFVar30 + 2 < pFVar37 && *pFVar30 == '/') {
    pFVar27 = (FT_Stream)(local_140 + -(long)(pFVar30 + 1));
    if ((int)pFVar27 - 1U < 0x15) {
      FVar32 = pFVar30[1];
      local_58 = (ulong)pFVar27 & 0xffffffff;
      lVar38 = local_58 - 1;
      pcVar18 = "CIDFontName";
      pTVar35 = cid_field_records;
      local_60 = CONCAT71(local_60._1_7_,FVar32);
      local_50 = pFVar27;
      do {
        if (FVar32 == *pcVar18) {
          sVar21 = strlen(pcVar18);
          FVar28 = local_38;
          pFVar37 = local_48;
          FVar32 = (FT_Byte)local_60;
          if (local_58 == sVar21) {
            if ((uint)local_50 < 2) {
LAB_00200121:
              if (pTVar35->type == T1_FIELD_TYPE_CALLBACK) {
                (*pTVar35->reader)(&local_40->root,&local_140);
                pFVar37 = local_48;
                FVar28 = local_38;
              }
              else {
                pCVar17 = local_68;
                switch(pTVar35->location) {
                case T1_FIELD_LOCATION_CID_INFO:
                  break;
                default:
                  if (((long)local_80 < 0) || ((local_40->cid).num_dicts <= local_80)) {
                    local_128 = 0xa0;
                    pCVar34 = local_40;
                    FVar13 = 0xa0;
                    goto LAB_001ff9f2;
                  }
                  pCVar17 = (local_40->cid).font_dicts + local_80;
                  break;
                case T1_FIELD_LOCATION_FONT_EXTRA:
                  pCVar17 = local_150;
                  break;
                case T1_FIELD_LOCATION_FONT_INFO:
                  pCVar17 = local_148;
                  break;
                case T1_FIELD_LOCATION_BBOX:
                  pCVar17 = local_158;
                }
                local_278 = pCVar17;
                if (pTVar35->type - T1_FIELD_TYPE_INTEGER_ARRAY < 2) {
                  local_128 = (*local_b8)();
                }
                else {
                  local_128 = (*local_c0)(&local_140,pTVar35,&local_278,0,0);
                }
              }
              pCVar34 = local_40;
              pFVar29 = local_140;
              FVar13 = local_128;
              if (local_128 != 0) goto LAB_001ff9f2;
              break;
            }
            lVar24 = 0;
            while ((pFVar30 + 2)[lVar24] == ((FT_Byte *)pcVar18)[lVar24 + 1]) {
              lVar24 = lVar24 + 1;
              if (lVar38 == lVar24) goto LAB_00200121;
            }
          }
        }
        pcVar18 = pTVar35[1].ident;
        pTVar35 = pTVar35 + 1;
        pCVar34 = local_40;
        pFVar37 = local_48;
      } while ((FT_Byte *)pcVar18 != (FT_Byte *)0x0);
    }
  }
  goto LAB_001fffd9;
LAB_0020020a:
  pCVar34 = local_40;
  FVar28 = local_38;
  FVar13 = 3;
  goto LAB_001ff9f2;
LAB_001fffd9:
  local_140 = pFVar29;
  (*local_108)(&local_140);
  pFVar30 = local_140;
  pFVar33 = local_140 + -0x11;
  if (pFVar37 <= local_140) {
    pFVar33 = local_70;
  }
  if (pFVar29 < pFVar33) {
    lVar38 = (long)pFVar33 - (long)pFVar29;
    iVar14 = local_80;
    do {
      if (((*pFVar29 == '%') &&
          (iVar15 = strncmp((char *)pFVar29,"%ADOBeginFontDict",0x11), iVar15 == 0)) &&
         (0 < (pCVar34->cid).num_dicts)) {
        iVar14 = iVar14 + 1;
        local_80 = iVar14;
      }
      pFVar29 = pFVar29 + 1;
      lVar38 = lVar38 + -1;
    } while (lVar38 != 0);
  }
  pFVar37 = local_48;
  if (((pFVar30 < local_48) && ((*local_100)(&local_140), pFVar29 = local_140, local_140 < pFVar37))
     && (local_128 == 0)) goto code_r0x0020007c;
  FVar28 = local_38;
  pFVar9 = local_160;
  if ((pCVar34->cid).num_dicts == 0) {
    FVar13 = 3;
    goto LAB_001ff9f2;
  }
  local_34 = local_128;
  FVar13 = local_34;
  if (local_38 < 0 || local_128 != 0) goto LAB_001ff9f2;
  pFVar27 = (FT_Stream)ft_mem_alloc(local_160,0x50,&local_34);
  pCVar34->cid_stream = pFVar27;
  FVar13 = local_34;
  if (local_34 != 0) goto LAB_001ff9f2;
  pFVar31 = (pCVar34->root).stream;
  if (local_90 != 0) {
    uVar20 = pFVar31->size - (long)local_98;
    if (uVar20 < local_90) {
      local_90 = uVar20;
    }
    pFVar29 = (FT_Byte *)ft_mem_alloc(pFVar9,local_90,&local_34);
    pCVar34->binary_data = pFVar29;
    FVar13 = local_34;
    if ((local_34 == 0) &&
       (local_34 = cid_hex_to_binary(pFVar29,local_90,(FT_ULong)local_98,
                                     (CID_Face)(pCVar34->root).stream), FVar13 = local_34,
       local_34 == 0)) {
      FT_Stream_OpenMemory(pCVar34->cid_stream,pCVar34->binary_data,local_90);
      pFVar29 = (FT_Byte *)0x0;
      goto LAB_0020033d;
    }
    goto LAB_001ff9f2;
  }
  for (lVar38 = 10; pFVar29 = local_98, lVar38 != 0; lVar38 = lVar38 + -1) {
    pFVar27->base = pFVar31->base;
    pFVar31 = (FT_Stream)((long)pFVar31 + (ulong)bVar39 * -0x10 + 8);
    pFVar27 = (FT_Stream)((long)pFVar27 + (ulong)bVar39 * -0x10 + 8);
  }
LAB_0020033d:
  (pCVar34->cid).data_offset = (FT_ULong)pFVar29;
  uVar5 = (pCVar34->cid).fd_bytes;
  if ((((int)uVar5 < 0) || (uVar6 = (pCVar34->cid).gd_bytes, (int)uVar6 < 1)) ||
     (4 < uVar5 || 4 < uVar6)) {
    local_34 = 3;
    FVar13 = local_34;
  }
  else {
    uVar20 = pCVar34->cid_stream->size - (long)pFVar29;
    lVar38 = (long)(pCVar34->cid).num_dicts;
    FVar28 = local_38;
    if (lVar38 < 1) {
LAB_0020040b:
      pFVar1 = &(pCVar34->cid).cidmap_offset;
      pCVar34 = local_40;
      if ((uVar20 < *pFVar1) ||
         ((uVar20 - *pFVar1) / (ulong)(uVar6 + uVar5) < (local_40->cid).cid_count)) {
        local_34 = 3;
        FVar13 = local_34;
      }
      else {
        FVar13 = cid_read_subrs(local_40);
        FVar28 = local_38;
      }
      goto LAB_001ff9f2;
    }
    pCVar17 = (pCVar34->cid).font_dicts;
    lVar24 = 0;
    while( true ) {
      uVar7 = *(uint *)((long)&pCVar17->sd_bytes + lVar24);
      if ((long)(int)uVar7 < 0) break;
      uVar8 = *(uint *)((long)&pCVar17->num_subrs + lVar24);
      if ((((uVar7 == 0) && (uVar8 != 0)) ||
          ((4 < uVar7 ||
           ((puVar2 = (ulong *)((long)&pCVar17->subrmap_offset + lVar24), uVar20 < *puVar2 ||
            ((int)uVar8 < 0)))))) ||
         ((uVar7 != 0 && ((uVar20 - *puVar2) / (ulong)(long)(int)uVar7 < (ulong)uVar8)))) break;
      lVar24 = lVar24 + 0x150;
      if (lVar38 * 0x150 - lVar24 == 0) goto LAB_0020040b;
    }
    local_34 = 3;
    FVar13 = local_34;
  }
LAB_001ff9f2:
  local_34 = FVar13;
  if (local_a8 != (FT_Byte *)0x0) {
    FT_Stream_ReleaseFrame(local_b0,&local_a8);
  }
  (*local_110)();
  FVar13 = local_34;
  if ((-1 < FVar28 && local_34 == 0) && (FVar13 = 6, (short)FVar28 == 0)) {
    (pCVar34->root).num_glyphs = (pCVar34->cid).cid_count;
    (pCVar34->root).num_charmaps = 0;
    (pCVar34->root).face_index = 0;
    uVar20 = (pCVar34->root).face_flags;
    (pCVar34->root).face_flags = uVar20 | 0x811;
    if ((pCVar34->cid).font_info.is_fixed_pitch != '\0') {
      (pCVar34->root).face_flags = uVar20 | 0x815;
    }
    pcVar18 = (pCVar34->cid).font_info.family_name;
    (pCVar34->root).family_name = pcVar18;
    (pCVar34->root).style_name = "Regular";
    if (pcVar18 == (char *)0x0) {
      pFVar11 = (pCVar34->cid).cid_font_name;
      if (pFVar11 != (FT_String *)0x0) {
        (pCVar34->root).family_name = pFVar11;
      }
    }
    else {
      pcVar23 = (pCVar34->cid).font_info.full_name;
      if (pcVar23 != (char *)0x0) {
        while (cVar3 = *pcVar23, cVar3 != '\0') {
          cVar4 = *pcVar18;
          if (cVar3 == cVar4) {
            pcVar18 = pcVar18 + 1;
LAB_001ffad9:
            pcVar23 = pcVar23 + 1;
          }
          else {
            if ((cVar3 == '-') || (cVar3 == ' ')) goto LAB_001ffad9;
            if ((cVar4 != ' ') && (cVar4 != '-')) {
              if (cVar4 == '\0') {
                (pCVar34->root).style_name = pcVar23;
              }
              break;
            }
            pcVar18 = pcVar18 + 1;
          }
        }
      }
    }
    uVar20 = (ulong)((pCVar34->cid).font_info.italic_angle != 0);
    (pCVar34->root).style_flags = uVar20;
    pcVar18 = (pCVar34->cid).font_info.weight;
    if ((pcVar18 != (char *)0x0) &&
       ((iVar14 = strcmp(pcVar18,"Bold"), iVar14 == 0 ||
        (iVar14 = strcmp(pcVar18,"Black"), iVar14 == 0)))) {
      (pCVar34->root).style_flags = uVar20 | 2;
    }
    (pCVar34->root).num_fixed_sizes = 0;
    (pCVar34->root).available_sizes = (FT_Bitmap_Size *)0x0;
    (pCVar34->root).bbox.xMin = (pCVar34->cid).font_bbox.xMin >> 0x10;
    lVar38 = (pCVar34->cid).font_bbox.yMin;
    (pCVar34->root).bbox.yMin = lVar38 >> 0x10;
    (pCVar34->root).bbox.xMax = (pCVar34->cid).font_bbox.xMax + 0xffff >> 0x10;
    lVar24 = (pCVar34->cid).font_bbox.yMax + 0xffff;
    (pCVar34->root).bbox.yMax = lVar24 >> 0x10;
    uVar25 = (pCVar34->root).units_per_EM;
    if (uVar25 == 0) {
      (pCVar34->root).units_per_EM = 1000;
      uVar25 = 1000;
    }
    sVar22 = (short)((ulong)lVar24 >> 0x10);
    (pCVar34->root).ascender = sVar22;
    sVar12 = (short)((ulong)lVar38 >> 0x10);
    (pCVar34->root).descender = sVar12;
    sVar26 = (short)((ulong)((uint)uVar25 * 0xc) * 0x1999999a >> 0x20);
    iVar14 = (int)sVar22 - (int)sVar12;
    sVar12 = (short)iVar14;
    if (iVar14 <= sVar26) {
      sVar12 = sVar26;
    }
    (pCVar34->root).height = sVar12;
    *(undefined4 *)&(pCVar34->root).underline_position =
         *(undefined4 *)&(pCVar34->cid).font_info.underline_position;
    FVar13 = 0;
  }
  return FVar13;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cid_face_init( FT_Stream      stream,
                 FT_Face        cidface,        /* CID_Face */
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    CID_Face          face = (CID_Face)cidface;
    FT_Error          error;
    PSAux_Service     psaux;
    PSHinter_Service  pshinter;

    FT_UNUSED( num_params );
    FT_UNUSED( params );
    FT_UNUSED( stream );


    cidface->num_faces = 1;

    psaux = (PSAux_Service)face->psaux;
    if ( !psaux )
    {
      psaux = (PSAux_Service)FT_Get_Module_Interface(
                FT_FACE_LIBRARY( face ), "psaux" );

      if ( !psaux )
      {
        FT_ERROR(( "cid_face_init: cannot access `psaux' module\n" ));
        error = FT_THROW( Missing_Module );
        goto Exit;
      }

      face->psaux = psaux;
    }

    pshinter = (PSHinter_Service)face->pshinter;
    if ( !pshinter )
    {
      pshinter = (PSHinter_Service)FT_Get_Module_Interface(
                   FT_FACE_LIBRARY( face ), "pshinter" );

      face->pshinter = pshinter;
    }

    FT_TRACE2(( "CID driver\n" ));

    /* open the tokenizer; this will also check the font format */
    if ( FT_STREAM_SEEK( 0 ) )
      goto Exit;

    error = cid_face_open( face, face_index );
    if ( error )
      goto Exit;

    /* if we just wanted to check the format, leave successfully now */
    if ( face_index < 0 )
      goto Exit;

    /* check the face index */
    /* XXX: handle CID fonts with more than a single face */
    if ( ( face_index & 0xFFFF ) != 0 )
    {
      FT_ERROR(( "cid_face_init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* now load the font program into the face object */

    /* initialize the face object fields */

    /* set up root face fields */
    {
      CID_FaceInfo  cid  = &face->cid;
      PS_FontInfo   info = &cid->font_info;


      cidface->num_glyphs   = (FT_Long)cid->cid_count;
      cidface->num_charmaps = 0;

      cidface->face_index = face_index & 0xFFFF;

      cidface->face_flags |= FT_FACE_FLAG_SCALABLE   | /* scalable outlines */
                             FT_FACE_FLAG_HORIZONTAL | /* horizontal data   */
                             FT_FACE_FLAG_HINTER;      /* has native hinter */

      if ( info->is_fixed_pitch )
        cidface->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      /* XXX: TODO: add kerning with .afm support */

      /* get style name -- be careful, some broken fonts only */
      /* have a /FontName dictionary entry!                   */
      cidface->family_name = info->family_name;
      /* assume "Regular" style if we don't know better */
      cidface->style_name = (char *)"Regular";
      if ( cidface->family_name )
      {
        char*  full   = info->full_name;
        char*  family = cidface->family_name;


        if ( full )
        {
          while ( *full )
          {
            if ( *full == *family )
            {
              family++;
              full++;
            }
            else
            {
              if ( *full == ' ' || *full == '-' )
                full++;
              else if ( *family == ' ' || *family == '-' )
                family++;
              else
              {
                if ( !*family )
                  cidface->style_name = full;
                break;
              }
            }
          }
        }
      }
      else
      {
        /* do we have a `/FontName'? */
        if ( cid->cid_font_name )
          cidface->family_name = cid->cid_font_name;
      }

      /* compute style flags */
      cidface->style_flags = 0;
      if ( info->italic_angle )
        cidface->style_flags |= FT_STYLE_FLAG_ITALIC;
      if ( info->weight )
      {
        if ( !ft_strcmp( info->weight, "Bold"  ) ||
             !ft_strcmp( info->weight, "Black" ) )
          cidface->style_flags |= FT_STYLE_FLAG_BOLD;
      }

      /* no embedded bitmap support */
      cidface->num_fixed_sizes = 0;
      cidface->available_sizes = NULL;

      cidface->bbox.xMin =   cid->font_bbox.xMin            >> 16;
      cidface->bbox.yMin =   cid->font_bbox.yMin            >> 16;
      /* no `U' suffix here to 0xFFFF! */
      cidface->bbox.xMax = ( cid->font_bbox.xMax + 0xFFFF ) >> 16;
      cidface->bbox.yMax = ( cid->font_bbox.yMax + 0xFFFF ) >> 16;

      if ( !cidface->units_per_EM )
        cidface->units_per_EM = 1000;

      cidface->ascender  = (FT_Short)( cidface->bbox.yMax );
      cidface->descender = (FT_Short)( cidface->bbox.yMin );

      cidface->height = (FT_Short)( ( cidface->units_per_EM * 12 ) / 10 );
      if ( cidface->height < cidface->ascender - cidface->descender )
        cidface->height = (FT_Short)( cidface->ascender - cidface->descender );

      cidface->underline_position  = (FT_Short)info->underline_position;
      cidface->underline_thickness = (FT_Short)info->underline_thickness;
    }

  Exit:
    return error;
  }